

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderMaxOutputVerticesTest::iterate(GeometryShaderMaxOutputVerticesTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  qpTestResult testResult;
  char *description;
  GLint max_output_vertices;
  string invalid_output_vertices_string;
  string valid_output_vertices_string;
  GLchar *geometry_shader_invalid_parts [3];
  GLchar *geometry_shader_valid_parts [3];
  stringstream stream_invalid;
  stringstream stream_valid;
  int local_53c;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528;
  undefined7 uStack_527;
  undefined1 *local_518;
  undefined8 local_510;
  undefined1 local_508;
  undefined7 uStack_507;
  char *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  undefined1 local_4c0 [16];
  TestLog local_4b0 [13];
  ios_base local_448 [264];
  long *local_340 [2];
  long local_330 [14];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base aiStack_138 [264];
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_518 = &local_508;
    local_510 = 0;
    local_508 = 0;
    local_538 = &local_528;
    local_530 = 0;
    local_528 = 0;
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,&local_53c);
    err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
    glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x7e4);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::operator<<(local_1a8,local_53c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_518,(string *)local_340);
    if (local_340[0] != local_330) {
      operator_delete(local_340[0],local_330[0] + 1);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::ostream::operator<<(local_330,local_53c + 1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_538,(string *)local_4c0);
    if ((TestLog *)local_4c0._0_8_ != local_4b0) {
      operator_delete((void *)local_4c0._0_8_,(ulong)((long)&(local_4b0[0].m_log)->flags + 1));
    }
    local_4d8 = 
    "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n// definition of NUMBER_OF_POINTS goes here\n#define NUMBER_OF_POINTS "
    ;
    local_4d0 = local_518;
    local_4c8 = 
    "u\n\nlayout(points)                                in;\nlayout(points, max_vertices=NUMBER_OF_POINTS) out;\n\nvoid main()\n{\n    int index = 0;\n\n    for (uint point = 0u; point < NUMBER_OF_POINTS; ++point)\n    {\n        EmitVertex();\n        EndPrimitive();\n    }\n\n}\n"
    ;
    local_4f8 = 
    "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n// definition of NUMBER_OF_POINTS goes here\n#define NUMBER_OF_POINTS "
    ;
    local_4f0 = local_538;
    local_4e8 = 
    "u\n\nlayout(points)                                in;\nlayout(points, max_vertices=NUMBER_OF_POINTS) out;\n\nvoid main()\n{\n    int index = 0;\n\n    for (uint point = 0u; point < NUMBER_OF_POINTS; ++point)\n    {\n        EmitVertex();\n        EndPrimitive();\n    }\n\n}\n"
    ;
    bVar2 = TestCaseBase::doesProgramBuild
                      (&this->super_TestCaseBase,1,&m_fragment_shader_code,3,&local_4d8,1,
                       &m_vertex_shader_code);
    bVar3 = TestCaseBase::doesProgramBuild
                      (&this->super_TestCaseBase,1,&m_fragment_shader_code,3,&local_4f8,1,
                       &m_vertex_shader_code);
    if (bVar2 && !bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      if (!bVar2) {
        local_4c0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_4c0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Failed to build valid program! GS::max_vertices set to MAX_GEOMETRY_OUTPUT_VERTICES.\n"
                   ,0x55);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_448);
      }
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      if (bVar3) {
        local_4c0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_4c0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Build of invalid program was successful! GS::max_vertices set to MAX_GEOMETRY_OUTPUT_VERTICES + 1.\n"
                   ,99);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_448);
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
               description);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(aiStack_138);
    if (local_538 != &local_528) {
      operator_delete(local_538,CONCAT71(uStack_527,local_528) + 1);
    }
    if (local_518 != &local_508) {
      operator_delete(local_518,CONCAT71(uStack_507,local_508) + 1);
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
             ,0x7d8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderMaxOutputVerticesTest::iterate()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get maximum number of output vertices and prepare strings */
	glw::GLint  max_output_vertices;
	std::string valid_output_vertices_string;
	std::string invalid_output_vertices_string;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &max_output_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname");

	std::stringstream stream_valid;
	stream_valid << max_output_vertices;
	valid_output_vertices_string = stream_valid.str();

	std::stringstream stream_invalid;
	stream_invalid << max_output_vertices + 1;
	invalid_output_vertices_string = stream_invalid.str();

	/* Geometry shader parts */
	const glw::GLchar* geometry_shader_valid_parts[] = { m_geometry_shader_code_preamble,
														 valid_output_vertices_string.c_str(),
														 m_geometry_shader_code_body };

	const glw::GLchar* geometry_shader_invalid_parts[] = { m_geometry_shader_code_preamble,
														   invalid_output_vertices_string.c_str(),
														   m_geometry_shader_code_body };

	/* Try to build programs */
	bool does_valid_build =
		doesProgramBuild(1, &m_fragment_shader_code, 3, geometry_shader_valid_parts, 1, &m_vertex_shader_code);

	bool does_invalid_build =
		doesProgramBuild(1, &m_fragment_shader_code, 3, geometry_shader_invalid_parts, 1, &m_vertex_shader_code);

	/* Verify results */
	if ((true == does_valid_build) && (false == does_invalid_build))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (true != does_valid_build)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to build valid program! GS::max_vertices "
														   "set to MAX_GEOMETRY_OUTPUT_VERTICES.\n"
							   << tcu::TestLog::EndMessage;
		}

		if (false != does_invalid_build)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Build of invalid program was successful! GS::max_vertices "
														   "set to MAX_GEOMETRY_OUTPUT_VERTICES + 1.\n"
							   << tcu::TestLog::EndMessage;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}